

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CORREL_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_RetCode TVar1;
  int *in_stack_00000038;
  int in_stack_00000044;
  double *in_stack_00000048;
  double *in_stack_00000050;
  int in_stack_0000005c;
  int in_stack_00000060;
  int *in_stack_00000070;
  double *in_stack_00000078;
  
  TVar1 = TA_CORREL(in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                    in_stack_00000044,in_stack_00000038,in_stack_00000070,in_stack_00000078);
  return TVar1;
}

Assistant:

TA_RetCode TA_CORREL_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CORREL(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inReal, /* inReal0 */
/* Generated */                params->in[1].data.inReal, /* inReal1 */
/* Generated */                params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal /*  outReal */ );
/* Generated */ }